

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_helpers.hpp
# Opt level: O0

void ear::
     mask_write<Eigen::Matrix<double,3,1,0,3,1>&,std::vector<bool,std::allocator<bool>>,Eigen::Matrix<double,2,1,0,2,1>>
               (Matrix<double,_3,_1,_0,_3,_1> *out,vector<bool,_std::allocator<bool>_> *mask,
               Matrix<double,_2,_1,_0,_2,_1> *values)

{
  const_reference cVar1;
  size_type sVar2;
  size_type sVar3;
  Index IVar4;
  CoeffReturnType pdVar5;
  size_type local_48;
  Index i;
  Index j;
  Index values_size;
  Index mask_size;
  Index out_size;
  Matrix<double,_2,_1,_0,_2,_1> *values_local;
  vector<bool,_std::allocator<bool>_> *mask_local;
  Matrix<double,_3,_1,_0,_3,_1> *out_local;
  
  sVar2 = Eigen::EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)out);
  sVar3 = std::vector<bool,_std::allocator<bool>_>::size(mask);
  IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)values);
  _assert_impl(sVar2 == sVar3,"in mask_write: out_size and mask_write must be the same length");
  i = 0;
  for (local_48 = 0; (long)local_48 < (long)sVar3; local_48 = local_48 + 1) {
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,local_48);
    if (cVar1) {
      pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0> *)values,i);
      vec_write<Eigen::Matrix<double,3,1,0,3,1>,double>(out,local_48,*pdVar5);
      i = i + 1;
    }
  }
  _assert_impl(i == IVar4,"in mask_size: length of values must equal the number of entries in mask")
  ;
  return;
}

Assistant:

void mask_write(OutT &&out, const MaskT &mask, const ValuesT &values) {
    Eigen::Index out_size = out.size();
    Eigen::Index mask_size = mask.size();
    Eigen::Index values_size = values.size();

    ear_assert(
        out_size == mask_size,
        "in mask_write: out_size and mask_write must be the same length");

    Eigen::Index j = 0;
    for (Eigen::Index i = 0; i < mask_size; i++)
      if (mask[i]) vec_write(out, i, values[j++]);

    ear_assert(j == values_size,
               "in mask_size: length of values must equal the number of "
               "entries in mask");
  }